

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  __type _Var1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  InfoType info;
  size_t idx;
  InfoType local_2c;
  size_t local_28;
  
  local_28 = 0;
  local_2c = 0;
  keyToIdx<std::__cxx11::string_const&>(this,key,&local_28,&local_2c);
  lVar2 = *(long *)(this + 0x20);
  uVar4 = (uint)*(byte *)(lVar2 + local_28);
  do {
    if (local_2c == uVar4) {
      _Var1 = std::operator==(key,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(*(long *)(this + 0x18) + local_28 * 8));
      if (_Var1) {
        return local_28;
      }
      lVar2 = *(long *)(this + 0x20);
    }
    iVar5 = *(int *)(this + 0x40);
    local_2c = local_2c + iVar5;
    sVar3 = local_28 + 1;
    if (local_2c == *(byte *)(lVar2 + 1 + local_28)) {
      lVar2 = local_28 * 8;
      local_28 = local_28 + 1;
      _Var1 = std::operator==(key,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(*(long *)(this + 0x18) + 8 + lVar2));
      if (_Var1) {
        return local_28;
      }
      iVar5 = *(int *)(this + 0x40);
      lVar2 = *(long *)(this + 0x20);
      sVar3 = local_28;
    }
    local_2c = local_2c + iVar5;
    local_28 = sVar3 + 1;
    uVar4 = (uint)*(byte *)(lVar2 + 1 + sVar3);
  } while (local_2c <= uVar4);
  if (*(long *)(this + 0x30) == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = lVar2 - *(long *)(this + 0x18) >> 3;
  }
  return sVar3;
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }